

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * ipx::Sortperm(Int m,double *values,bool reverse)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  reference pvVar1;
  byte in_CL;
  long in_RDX;
  int in_ESI;
  allocator_type *in_RDI;
  Int i;
  vector<int,_std::allocator<int>_> *perm;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  anon_class_8_1_70098e60 comp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  int local_30;
  vector<int,_std::allocator<int>_> local_1b;
  
  local_1b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _2_1_ = in_CL & 1;
  local_1b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _1_1_ = 0;
  end._M_current = (int *)(long)in_ESI;
  begin._M_current = (int *)&local_1b;
  comp.values = (double **)in_RDI;
  local_1b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._3_8_ =
       in_RDX;
  local_1b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._15_4_ =
       in_ESI;
  std::allocator<int>::allocator((allocator<int> *)0x8540d4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)begin._M_current,(size_type)end._M_current,
             (allocator_type *)comp.values);
  std::allocator<int>::~allocator((allocator<int> *)0x8540f4);
  for (local_30 = 0;
      local_30 <
      (int)local_1b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _15_4_; local_30 = local_30 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)comp.values,(long)local_30);
    *pvVar1 = local_30;
  }
  if (local_1b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._3_8_
      != 0) {
    if ((local_1b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start._2_1_ & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
      std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__1>
                (begin,end,comp);
    }
    else {
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
      std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__0>
                (begin,end,comp);
    }
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<Int> Sortperm(Int m, const double* values, bool reverse) {
    std::vector<Int> perm(m);
    for (Int i = 0; i < m; i++) perm[i] = i;
    if (!values) return perm;

    if (reverse)
        pdqsort(perm.begin(), perm.end(), [&](Int i, Int j) {
            return std::make_pair(values[i], i) > std::make_pair(values[j], j);
        });
    else
        pdqsort(perm.begin(), perm.end(), [&](Int i, Int j) {
            return std::make_pair(values[i], i) < std::make_pair(values[j], j);
        });

    return perm;
}